

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::FieldGeneratorMap::FieldGeneratorMap
          (FieldGeneratorMap *this,Descriptor *descriptor,Options *options)

{
  ulong uVar1;
  int iVar2;
  ulong *puVar3;
  long *plVar4;
  scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *psVar5;
  FieldGenerator *pFVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int i;
  long lVar10;
  
  this->descriptor_ = descriptor;
  uVar7 = (ulong)*(int *)(descriptor + 0x2c);
  uVar1 = uVar7 * 8;
  uVar8 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar8 = 0xffffffffffffffff;
  }
  if ((long)uVar7 < 0) {
    uVar8 = 0xffffffffffffffff;
  }
  puVar3 = (ulong *)operator_new__(uVar8);
  *puVar3 = uVar7;
  if (uVar7 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *)(puVar3 + 1),0,
           uVar1);
  }
  (this->field_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *)(puVar3 + 1);
  iVar2 = *(int *)(descriptor + 0x78);
  lVar9 = (long)iVar2;
  uVar1 = lVar9 * 8;
  uVar8 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar8 = 0xffffffffffffffff;
  }
  if (lVar9 < 0) {
    uVar8 = 0xffffffffffffffff;
  }
  plVar4 = (long *)operator_new__(uVar8);
  *plVar4 = lVar9;
  if (iVar2 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *)(plVar4 + 1),0,
           uVar1);
  }
  (this->extension_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *)(plVar4 + 1);
  lVar9 = 0;
  for (lVar10 = 0; lVar10 < (int)uVar7; lVar10 = lVar10 + 1) {
    psVar5 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>_>
             ::operator[](&this->field_generators_,lVar10);
    pFVar6 = FieldGenerator::Make((FieldDescriptor *)(*(long *)(descriptor + 0x30) + lVar9),options)
    ;
    internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::reset
              (psVar5,pFVar6);
    uVar7 = (ulong)*(uint *)(descriptor + 0x2c);
    lVar9 = lVar9 + 0xa8;
  }
  lVar9 = 0;
  for (lVar10 = 0; lVar10 < *(int *)(descriptor + 0x78); lVar10 = lVar10 + 1) {
    psVar5 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>_>
             ::operator[](&this->extension_generators_,lVar10);
    pFVar6 = FieldGenerator::Make((FieldDescriptor *)(*(long *)(descriptor + 0x80) + lVar9),options)
    ;
    internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::reset
              (psVar5,pFVar6);
    lVar9 = lVar9 + 0xa8;
  }
  return;
}

Assistant:

FieldGeneratorMap::FieldGeneratorMap(const Descriptor* descriptor,
                                     const Options& options)
    : descriptor_(descriptor),
      field_generators_(
          new scoped_ptr<FieldGenerator>[descriptor->field_count()]),
      extension_generators_(
          new scoped_ptr<FieldGenerator>[descriptor->extension_count()]) {
  // Construct all the FieldGenerators.
  for (int i = 0; i < descriptor->field_count(); i++) {
    field_generators_[i].reset(
        FieldGenerator::Make(descriptor->field(i), options));
  }
  for (int i = 0; i < descriptor->extension_count(); i++) {
    extension_generators_[i].reset(
        FieldGenerator::Make(descriptor->extension(i), options));
  }
}